

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::ListCoinsTestingSetup(ListCoinsTestingSetup *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  Chain *chain;
  TestOpts opts;
  undefined8 __p;
  Chainstate *pCVar1;
  long in_FS_OFFSET;
  pointer in_stack_fffffffffffffeb8;
  pointer in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  CPubKey local_108;
  direct_or_indirect local_c0;
  uint local_a4;
  CBlock local_a0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffec0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffeb8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffec8;
  opts._24_8_ = in_stack_fffffffffffffed0;
  TestChain100Setup::TestChain100Setup(&this->super_TestChain100Setup,REGTEST,opts);
  (this->wallet)._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
  _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
  super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl = (CWallet *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey(&local_108,this_00);
  GetScriptForRawPubKey((CScript *)&local_c0.indirect_contents,&local_108);
  TestChain100Setup::CreateAndProcessBlock
            (&local_a0,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &stack0xfffffffffffffeb8,(CScript *)&local_c0.indirect_contents,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a0.vtx);
  if (0x1c < local_a4) {
    free(local_c0.indirect_contents.indirect);
    local_c0.indirect_contents.indirect = (char *)0x0;
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &stack0xfffffffffffffeb8);
  chain = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x24a,"ListCoinsTestingSetup","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x24a,"operator()","m_node.chainman");
  local_108.vch._0_8_ = &cs_main;
  local_108.vch[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_108);
  pCVar1 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_108);
  CreateSyncedWallet((wallet *)&local_c0.indirect_contents,chain,&pCVar1->m_chain,this_00);
  __p = local_c0.indirect_contents.indirect;
  local_c0.indirect_contents.indirect = (char *)0x0;
  std::__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::reset
            ((__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &this->wallet,(pointer)__p);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &local_c0.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

ListCoinsTestingSetup()
    {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
        wallet = CreateSyncedWallet(*m_node.chain, WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain()), coinbaseKey);
    }